

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

char units::getMatchCharacter(char mchar)

{
  char local_9;
  char mchar_local;
  
  switch(mchar) {
  case '\"':
  case '\'':
  case '`':
  default:
    local_9 = mchar;
    break;
  case '(':
    local_9 = ')';
    break;
  case ')':
    local_9 = '(';
    break;
  case '<':
    local_9 = '>';
    break;
  case '>':
    local_9 = '<';
    break;
  case '[':
    local_9 = ']';
    break;
  case ']':
    local_9 = '[';
    break;
  case '{':
    local_9 = '}';
    break;
  case '}':
    local_9 = '{';
  }
  return local_9;
}

Assistant:

static char getMatchCharacter(char mchar)
{
    switch (mchar) {
        case '{':
            return '}';
        case '[':
            return ']';
        case '(':
            return ')';
        case '<':
            return '>';
        case '}':
            return '{';
        case ']':
            return '[';
        case ')':
            return '(';
        case '>':
            return '<';
        case '\'':
        case '"':
        case '`':
        default:
            return mchar;
    }
}